

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# munkres.hxx
# Opt level: O1

void __thiscall
markurem::matching::
Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
::step_six(Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
           *this)

{
  ulong *puVar1;
  pointer pVVar2;
  _Bit_type *p_Var3;
  _Bit_type *p_Var4;
  ulong uVar5;
  pointer pAVar6;
  vector<double,_std::allocator<double>_> *pvVar7;
  pointer pdVar8;
  unsigned_long *row;
  ulong *puVar9;
  ulong uVar10;
  long lVar11;
  ulong uVar12;
  ulong uVar13;
  pointer pAVar14;
  value_type vVar15;
  
  vVar15 = find_smallest(this);
  puVar9 = (this->rows_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (this->rows_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar9 != puVar1) {
    pVVar2 = (this->graph_->vertices_).
             super__Vector_base<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex,_std::allocator<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::Vertex>_>
             ._M_impl.super__Vector_impl_data._M_start;
    p_Var3 = (this->row_cover).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    lVar11 = (long)(this->rows_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                   _M_impl.super__Vector_impl_data._M_finish - (long)puVar9;
    p_Var4 = (this->col_cover).super__Bvector_base<std::allocator<bool>_>._M_impl.
             super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p;
    do {
      uVar5 = *puVar9;
      pAVar14 = *(pointer *)&((Adjacencies *)((long)(pVVar2 + uVar5) + 0x20))->vector_;
      pAVar6 = *(pointer *)((long)(pVVar2 + uVar5) + 0x28);
      if (pAVar14 != pAVar6) {
        uVar12 = uVar5 + 0x3f;
        if (-1 < (long)uVar5) {
          uVar12 = uVar5;
        }
        uVar12 = p_Var3[((long)uVar12 >> 6) +
                        (ulong)((uVar5 & 0x800000000000003f) < 0x8000000000000001) +
                        0xffffffffffffffff];
        pvVar7 = this->costs_;
        do {
          if ((1L << ((byte)uVar5 & 0x3f) & uVar12) != 0) {
            pdVar8 = (pvVar7->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar8[pAVar14->edge_] = pdVar8[pAVar14->edge_] + vVar15;
          }
          uVar13 = pAVar14->vertex_ - (lVar11 >> 3);
          uVar10 = uVar13 + 0x3f;
          if (-1 < (long)uVar13) {
            uVar10 = uVar13;
          }
          if ((p_Var4[((long)uVar10 >> 6) +
                      (ulong)((uVar13 & 0x800000000000003f) < 0x8000000000000001) +
                      0xffffffffffffffff] >> (uVar13 & 0x3f) & 1) == 0) {
            pdVar8 = (pvVar7->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            pdVar8[pAVar14->edge_] = pdVar8[pAVar14->edge_] - vVar15;
          }
          pAVar14 = pAVar14 + 1;
        } while (pAVar14 != pAVar6);
      }
      puVar9 = puVar9 + 1;
    } while (puVar9 != puVar1);
  }
  this->step_ = FOUR;
  return;
}

Assistant:

void
Matching<GRAPH, COST, MASK>::step_six()
{
    auto const& minval = find_smallest();
    for (auto const& row : rows_) {
        for (auto it = graph_.adjacenciesFromVertexBegin(row);
             it != graph_.adjacenciesFromVertexEnd(row); ++it) {
            if (row_cover[row])
                costs_[it->edge()] += minval;
            if (!col_cover[col_of_idx(it->vertex())])
                costs_[it->edge()] -= minval;
        }
    }
    step_ = Step::FOUR;
}